

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_4,_int>_>::setIdentity
          (PermutationBase<Eigen::PermutationMatrix<_1,_4,_int>_> *this,Index newSize)

{
  ulong uVar1;
  
  if ((uint)newSize < 5) {
    *(ulong *)(this + 0x10) = (ulong)(uint)newSize;
    if (newSize != 0) {
      uVar1 = 0;
      do {
        *(int *)(this + uVar1 * 4) = (int)uVar1;
        uVar1 = uVar1 + 1;
      } while ((uint)newSize != uVar1);
    }
    return;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x10c,
                "void Eigen::PlainObjectBase<Eigen::Matrix<int, -1, 1, 0, 4, 1>>::resize(Index) [Derived = Eigen::Matrix<int, -1, 1, 0, 4, 1>]"
               );
}

Assistant:

inline void resize(Index size)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(PlainObjectBase)
      eigen_assert(((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0);
      #ifdef EIGEN_INITIALIZE_COEFFS
        bool size_changed = size != this->size();
      #endif
      if(RowsAtCompileTime == 1)
        m_storage.resize(size, 1, size);
      else
        m_storage.resize(size, size, 1);
      #ifdef EIGEN_INITIALIZE_COEFFS
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #endif
    }